

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

bool leveldb::GetVarint32(Slice *input,uint32_t *value)

{
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  Slice local_48;
  char *local_38;
  char *q;
  char *limit;
  char *p;
  uint32_t *value_local;
  Slice *input_local;
  
  p = (char *)value;
  value_local = (uint32_t *)input;
  pcVar1 = Slice::data(input);
  limit = pcVar1;
  sVar2 = Slice::size((Slice *)value_local);
  q = pcVar1 + sVar2;
  local_38 = GetVarint32Ptr(limit,q,(uint32_t *)p);
  bVar3 = local_38 != (char *)0x0;
  if (bVar3) {
    Slice::Slice(&local_48,local_38,(long)q - (long)local_38);
    *(char **)value_local = local_48.data_;
    *(size_t *)(value_local + 2) = local_48.size_;
  }
  return bVar3;
}

Assistant:

bool GetVarint32(Slice* input, uint32_t* value) {
  const char* p = input->data();
  const char* limit = p + input->size();
  const char* q = GetVarint32Ptr(p, limit, value);
  if (q == nullptr) {
    return false;
  } else {
    *input = Slice(q, limit - q);
    return true;
  }
}